

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase628::run(TestCase628 *this)

{
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_04;
  Builder builder_05;
  BuilderArena *pBVar1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  undefined8 local_2f8;
  Builder root;
  Reader local_2c8;
  Orphanage orphanage;
  Builder local_280;
  Builder local_258;
  Builder local_230;
  Builder local_208;
  Builder local_1e0;
  Reader local_1b8;
  Reader local_188;
  Reader local_158;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  builder_04._builder.capTable = orphan.builder.capTable;
  builder_04._builder.segment = orphan.builder.segment;
  builder_04._builder.data = orphan.builder.location;
  builder_04._builder.pointers = (WirePointer *)local_2f8;
  builder_04._builder._32_8_ = root._builder.segment;
  orphanage = Orphanage::getForMessageContaining<capnproto_test::capnp::test::TestAllTypes::Builder>
                        (builder_04);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_1e0,&orphan.builder);
  builder_00._builder.capTable = local_1e0._builder.capTable;
  builder_00._builder.segment = local_1e0._builder.segment;
  builder_00._builder.data = local_1e0._builder.data;
  builder_00._builder.pointers = local_1e0._builder.pointers;
  builder_00._builder.dataSize = local_1e0._builder.dataSize;
  builder_00._builder.pointerCount = local_1e0._builder.pointerCount;
  builder_00._builder._38_2_ = local_1e0._builder._38_2_;
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField(&root,&orphan);
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_128,&local_2c8);
  reader._reader.capTable = local_128._reader.capTable;
  reader._reader.segment = local_128._reader.segment;
  reader._reader.data = local_128._reader.data;
  reader._reader.pointers = local_128._reader.pointers;
  reader._reader.dataSize = local_128._reader.dataSize;
  reader._reader.pointerCount = local_128._reader.pointerCount;
  reader._reader._38_2_ = local_128._reader._38_2_;
  reader._reader.nestingLimit = local_128._reader.nestingLimit;
  reader._reader._44_4_ = local_128._reader._44_4_;
  checkTestMessage(reader);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initBoolList(&local_208,&root,3);
  builder_05.builder.capTable = orphan.builder.capTable;
  builder_05.builder.segment = orphan.builder.segment;
  builder_05.builder.ptr = (byte *)orphan.builder.location;
  builder_05.builder._24_8_ = local_2f8;
  builder_05.builder._32_8_ = root._builder.segment;
  orphanage = Orphanage::getForMessageContaining<capnp::List<bool,(capnp::Kind)0>::Builder>
                        (builder_05);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_230,&orphan.builder);
  builder_01._builder.capTable = local_230._builder.capTable;
  builder_01._builder.segment = local_230._builder.segment;
  builder_01._builder.data = local_230._builder.data;
  builder_01._builder.pointers = local_230._builder.pointers;
  builder_01._builder.dataSize = local_230._builder.dataSize;
  builder_01._builder.pointerCount = local_230._builder.pointerCount;
  builder_01._builder._38_2_ = local_230._builder._38_2_;
  initTestMessage(builder_01);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField(&root,&orphan);
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_158,&local_2c8);
  reader_00._reader.capTable = local_158._reader.capTable;
  reader_00._reader.segment = local_158._reader.segment;
  reader_00._reader.data = local_158._reader.data;
  reader_00._reader.pointers = local_158._reader.pointers;
  reader_00._reader.dataSize = local_158._reader.dataSize;
  reader_00._reader.pointerCount = local_158._reader.pointerCount;
  reader_00._reader._38_2_ = local_158._reader._38_2_;
  reader_00._reader.nestingLimit = local_158._reader.nestingLimit;
  reader_00._reader._44_4_ = local_158._reader._44_4_;
  checkTestMessage(reader_00);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  local_2c8._reader.dataSize = root._builder.dataSize;
  local_2c8._reader.pointerCount = root._builder.pointerCount;
  local_2c8._reader._38_2_ = root._builder._38_2_;
  local_2c8._reader.data = root._builder.data;
  local_2c8._reader.pointers = root._builder.pointers;
  local_2c8._reader.segment = &(root._builder.segment)->super_SegmentReader;
  local_2c8._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  pBVar1 = StructBuilder::getArena((StructBuilder *)&local_2c8);
  orphanage.capTable = StructBuilder::getCapTable((StructBuilder *)&local_2c8);
  orphanage.arena = pBVar1;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_258,&orphan.builder);
  builder_02._builder.capTable = local_258._builder.capTable;
  builder_02._builder.segment = local_258._builder.segment;
  builder_02._builder.data = local_258._builder.data;
  builder_02._builder.pointers = local_258._builder.pointers;
  builder_02._builder.dataSize = local_258._builder.dataSize;
  builder_02._builder.pointerCount = local_258._builder.pointerCount;
  builder_02._builder._38_2_ = local_258._builder._38_2_;
  initTestMessage(builder_02);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField(&root,&orphan);
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_188,&local_2c8);
  reader_01._reader.capTable = local_188._reader.capTable;
  reader_01._reader.segment = local_188._reader.segment;
  reader_01._reader.data = local_188._reader.data;
  reader_01._reader.pointers = local_188._reader.pointers;
  reader_01._reader.dataSize = local_188._reader.dataSize;
  reader_01._reader.pointerCount = local_188._reader.pointerCount;
  reader_01._reader._38_2_ = local_188._reader._38_2_;
  reader_01._reader.nestingLimit = local_188._reader.nestingLimit;
  reader_01._reader._44_4_ = local_188._reader._44_4_;
  checkTestMessage(reader_01);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initBoolList((Builder *)&orphan,&root,3);
  ListSchema::FromImpl<capnp::List<bool,_(capnp::Kind)0>_>::get();
  local_2c8._reader.data = orphan.builder.capTable;
  local_2c8._reader.pointers = (WirePointer *)orphan.builder.location;
  local_2c8._reader.segment = (SegmentReader *)orphan.builder.tag.content;
  local_2c8._reader.capTable = (CapTableReader *)orphan.builder.segment;
  pBVar1 = ListBuilder::getArena((ListBuilder *)&local_2c8);
  orphanage.capTable = ListBuilder::getCapTable((ListBuilder *)&local_2c8);
  orphanage.arena = pBVar1;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_280,&orphan.builder);
  builder_03._builder.capTable = local_280._builder.capTable;
  builder_03._builder.segment = local_280._builder.segment;
  builder_03._builder.data = local_280._builder.data;
  builder_03._builder.pointers = local_280._builder.pointers;
  builder_03._builder.dataSize = local_280._builder.dataSize;
  builder_03._builder.pointerCount = local_280._builder.pointerCount;
  builder_03._builder._38_2_ = local_280._builder._38_2_;
  initTestMessage(builder_03);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField(&root,&orphan);
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_1b8,&local_2c8);
  reader_02._reader.capTable = local_1b8._reader.capTable;
  reader_02._reader.segment = local_1b8._reader.segment;
  reader_02._reader.data = local_1b8._reader.data;
  reader_02._reader.pointers = local_1b8._reader.pointers;
  reader_02._reader.dataSize = local_1b8._reader.dataSize;
  reader_02._reader.pointerCount = local_1b8._reader.pointerCount;
  reader_02._reader._38_2_ = local_1b8._reader._38_2_;
  reader_02._reader.nestingLimit = local_1b8._reader.nestingLimit;
  reader_02._reader._44_4_ = local_1b8._reader._44_4_;
  checkTestMessage(reader_02);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageFromBuilder) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root);
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root.initBoolList(3));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

#if !CAPNP_LITE
  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root.initBoolList(3)));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }
#endif  // !CAPNP_LITE
}